

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O1

int __thiscall
Potassco::TheoryData::accept(TheoryData *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Data *pDVar1;
  bool bVar2;
  uint uVar3;
  Id_t IVar4;
  Id_t id;
  int iVar5;
  uint *puVar6;
  iterator pIVar7;
  TheoryTerm *pTVar8;
  undefined7 extraout_var;
  TheoryTerm *pTVar9;
  undefined4 in_register_00000034;
  
  pTVar9 = (TheoryTerm *)CONCAT44(in_register_00000034,__fd);
  if (pTVar9->data_ == 0xffffffffffffffff) {
    fail(-2,"Theory_t Potassco::TheoryTerm::type() const",0x4d,"valid()","Invalid term",0);
  }
  uVar3 = (uint)pTVar9->data_ & 3;
  if (uVar3 == 2) {
    puVar6 = TheoryTerm::begin(pTVar9);
    pIVar7 = TheoryTerm::end(pTVar9);
    for (; puVar6 != pIVar7; puVar6 = puVar6 + 1) {
      uVar3 = *puVar6;
      if (((int)__addr_len == 0) ||
         (((pDVar1 = this->data_, uVar3 < (uint)((pDVar1->terms).top >> 3) &&
           (*(long *)((long)(pDVar1->terms).mem.beg_ + (ulong)uVar3 * 8) != -1)) &&
          ((pDVar1->frame).term <= uVar3)))) {
        pTVar8 = getTerm(this,uVar3);
        (**(code **)(*(long *)__addr + 0x10))(__addr,this,(ulong)uVar3,pTVar8);
      }
    }
    bVar2 = TheoryTerm::isFunction(pTVar9);
    uVar3 = (uint)CONCAT71(extraout_var,bVar2);
    if ((bVar2) &&
       ((uVar3 = TheoryTerm::function(pTVar9), (int)__addr_len == 0 ||
        (((pDVar1 = this->data_, uVar3 < (uint)((pDVar1->terms).top >> 3) &&
          (*(long *)((long)(pDVar1->terms).mem.beg_ + (ulong)uVar3 * 8) != -1)) &&
         ((pDVar1->frame).term <= uVar3)))))) {
      IVar4 = TheoryTerm::function(pTVar9);
      id = TheoryTerm::function(pTVar9);
      pTVar9 = getTerm(this,id);
      iVar5 = (**(code **)(*(long *)__addr + 0x10))
                        (__addr,this,IVar4,pTVar9,*(code **)(*(long *)__addr + 0x10));
      return iVar5;
    }
  }
  return uVar3;
}

Assistant:

bool TheoryTerm::valid() const { return data_ != nulTerm; }